

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O3

void __thiscall
phpconvert::ZendParser::generatePreparedTypeFull
          (ZendParser *this,PreparedType *outPrep,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tmpVect)

{
  StringHelper *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  int iVar4;
  long lVar5;
  iterator iVar6;
  long *plVar7;
  size_type *psVar8;
  string *out;
  size_type sVar9;
  string tmpString;
  stringstream stream;
  string local_218;
  key_type local_1f8;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8 [4];
  ios_base local_138 [264];
  
  lVar5 = std::__cxx11::string::find((char *)outPrep,0x1311a2,0);
  if (lVar5 == -1) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_local_buf[0] = '\0';
    this_00 = this->stringHelper;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"_","");
    StringHelper::split(this_00,tmpVect,&local_218,&outPrep->type);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_assign((string *)&local_1f8);
    sVar3 = local_1f8._M_string_length;
    _Var2._M_p = local_1f8._M_dataplus._M_p;
    if (local_1f8._M_string_length != 0) {
      sVar9 = 0;
      do {
        iVar4 = tolower((int)_Var2._M_p[sVar9]);
        _Var2._M_p[sVar9] = (char)iVar4;
        sVar9 = sVar9 + 1;
      } while (sVar3 != sVar9);
    }
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&this->keywords->_M_t,&local_1f8);
    psVar1 = this->keywords;
    extractNamespace(this,&outPrep->type,&local_1f8,tmpVect);
    generateAlias(&local_1d8,this,&outPrep->type,
                  ((_Rb_tree_header *)iVar6._M_node != &(psVar1->_M_t)._M_impl.super__Rb_tree_header
                  ) + 1,tmpVect);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x1311a2);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_218.field_2._M_allocated_capacity = *psVar8;
      local_218.field_2._8_8_ = plVar7[3];
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    }
    else {
      local_218.field_2._M_allocated_capacity = *psVar8;
      local_218._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_218._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_218._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    out = &outPrep->alias;
    generateNamespace(this,&local_1f8,out);
    std::operator+(&local_218,"\\",out);
    std::__cxx11::string::operator=((string *)out,(string *)&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    std::operator+(local_1b8,"\\",&outPrep->type);
    std::__cxx11::string::operator=((string *)&outPrep->alias,(string *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
      operator_delete(local_1b8[0]._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void ZendParser::generatePreparedTypeFull(PreparedType &outPrep,
                                              vector<string> &tmpVect) {
        if (hasDelimeter(outPrep)) {
            outPrep.alias = NAMESPACE_SEPARATOR + outPrep.type; //extract const - ns sep.
            return;
        }

        stringstream stream;
        string tmpString;
        size_t size = 1;

        this->stringHelper->split(tmpVect, DELIMETER, outPrep.type);

        tmpString = tmpVect[tmpVect.size() - 1];
        toLower(tmpString);

        if (isKeyword(tmpString)) {
            size = 2;
        }

        extractNamespace(outPrep.type, tmpString, tmpVect);
        tmpString += DELIMETER + generateAlias(outPrep.type, size, tmpVect);
        generateNamespace(tmpString, outPrep.alias);

        outPrep.alias = NAMESPACE_SEPARATOR + outPrep.alias;
    }